

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContextLimits::addExtension(ReferenceContextLimits *this,char *extension)

{
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,extension,&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->extensionList,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((this->extensionStr)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->extensionStr);
  }
  std::__cxx11::string::append((char *)&this->extensionStr);
  return;
}

Assistant:

void ReferenceContextLimits::addExtension (const char* extension)
{
	extensionList.push_back(extension);

	if (!extensionStr.empty())
		extensionStr += " ";
	extensionStr += extension;
}